

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chargen.cpp
# Opt level: O0

int anon_unknown.dwarf_1b44::underline_count(int glyph,int begin,int end)

{
  int local_1c;
  int local_18;
  int col;
  int count;
  int end_local;
  int begin_local;
  int glyph_local;
  
  local_18 = pixel_count(glyph,begin,end);
  if ((begin < 9) && (9 < end)) {
    for (local_1c = 0; local_1c < 10; local_1c = local_1c + 1) {
      if (*(char *)(*(long *)((anonymous_namespace)::glyphs + (long)glyph * 0x50 + 0x48) +
                   (long)local_1c) == '_') {
        local_18 = local_18 + 1;
      }
    }
  }
  return local_18;
}

Assistant:

int underline_count(int glyph, int begin, int end)
{
    int count = pixel_count(glyph, begin, end);
    if (begin < 9 && 9 < end)
    {
        for (int col = 0; col < 10; ++col)
        {
            if (glyphs[glyph][9][col] == '_')
                ++count;
        }
    }
    return count;
}